

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::wait_for_impl(size_t mill_sec,callable *func,vector *args)

{
  future_status fVar1;
  string *str;
  proxy *in_RDI;
  future<cs_impl::any> future;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff58;
  __basic_future<cs_impl::any> *in_stack_ffffffffffffff60;
  allocator *this;
  allocator local_79;
  future<cs_impl::any> *in_stack_ffffffffffffff88;
  duration<long,std::ratio<1l,1000l>> local_48 [24];
  type *in_stack_ffffffffffffffd0;
  launch in_stack_ffffffffffffffdc;
  unsigned_long local_10 [2];
  
  std::
  async<cs_impl::runtime_cs_ext::wait_for_impl(unsigned_long,cs::callable_const&,std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)::__0>
            (in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>(local_48,local_10);
  fVar1 = std::__basic_future<cs_impl::any>::wait_for<long,std::ratio<1l,1000l>>
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (fVar1 != ready) {
    str = (string *)__cxa_allocate_exception(0x20);
    this = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff88,"Target function deferred or timeout.",this);
    cs::lang_error::lang_error((lang_error *)this,str);
    __cxa_throw(str,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  std::future<cs_impl::any>::get(in_stack_ffffffffffffff88);
  std::future<cs_impl::any>::~future((future<cs_impl::any> *)0x43baf2);
  return (var)in_RDI;
}

Assistant:

cs::var wait_for_impl(std::size_t mill_sec, const cs::callable &func, cs::vector &args)
		{
			std::future<cs::var> future = std::async(std::launch::async, [&func, &args]() -> var {
				return wait_worker(func, args);
			});
			if (future.wait_for(std::chrono::milliseconds(mill_sec)) != std::future_status::ready)
				throw cs::lang_error("Target function deferred or timeout.");
			else
				return future.get();
		}